

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

ON_Object * __thiscall ON_RevSurface::Internal_DeepCopy(ON_RevSurface *this)

{
  ON_RevSurface *this_00;
  
  this_00 = (ON_RevSurface *)operator_new(0xa0);
  ON_RevSurface(this_00,this);
  return (ON_Object *)this_00;
}

Assistant:

void ON_RevSurface::DestroyRuntimeCache( bool bDelete )
{
  ON_Surface::DestroyRuntimeCache(bDelete);
  if ( 0 != m_curve )
    m_curve->DestroyRuntimeCache(bDelete);
  // 15 August 2003 Dale Lear
  //    Added the call to destroy m_bbox.
  m_bbox.Destroy();
}